

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O2

int __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::compare
          (basic_string_view<char,_std::char_traits<char>_> *this,size_type pos1,size_type n1,
          char *s)

{
  int iVar1;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  substr(&local_20,(size_type)this,pos1);
  local_30.size_ = strlen(s);
  local_30.data_ = s;
  iVar1 = compare(&local_20,&local_30);
  return iVar1;
}

Assistant:

nssv_constexpr int compare( size_type pos1, size_type n1, CharT const * s ) const // (5)
    {
        return substr( pos1, n1 ).compare( basic_string_view( s ) );
    }